

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetAppBundleDirectory
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool contentOnly)

{
  bool contentOnly_local;
  string *config_local;
  cmTarget *this_local;
  string *fpath;
  
  GetFullName(__return_storage_ptr__,this,config,false);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".app/Contents");
  if (!contentOnly) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/MacOS");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetAppBundleDirectory(const std::string& config,
                                            bool contentOnly) const
{
  std::string fpath = this->GetFullName(config, false);
  fpath += ".app/Contents";
  if(!contentOnly)
    fpath += "/MacOS";
  return fpath;
}